

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bcast.cpp
# Opt level: O1

void Omega_h::bcast_mesh(Mesh *mesh,CommPtr *new_comm,bool is_source)

{
  int *piVar1;
  iterator __position;
  Mesh *pMVar2;
  I32 IVar3;
  Int IVar4;
  ulong uVar5;
  TagBase *this;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *this_00;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  int i;
  Alloc *pAVar12;
  I32 ncomps;
  ClassPair pair;
  I32 dim;
  Adj down;
  I32 nsets;
  I32 tag_type;
  I32 parting;
  I32 family;
  Int local_144;
  string local_140;
  ulong local_120;
  Mesh *local_118;
  uint local_10c;
  undefined1 local_108 [32];
  Alloc *local_e8;
  void *local_e0;
  Read<signed_char> local_d8;
  int local_bc;
  Omega_h_Parting local_b8;
  Omega_h_Family local_b4;
  Adj local_b0;
  Read<double> local_80;
  Read<long> local_70;
  Read<int> local_60;
  Read<signed_char> local_50;
  Read<int> local_40;
  
  IVar3 = Comm::rank((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  if (IVar3 == 0 && !is_source) {
    pcVar11 = "is_source";
    pcVar8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_bcast.cpp"
    ;
    uVar7 = 9;
LAB_0022ea47:
    fail("assertion %s failed at %s +%d\n",pcVar11,pcVar8,uVar7);
  }
  if (is_source) {
    local_b4 = mesh->family_;
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_b4,0);
    local_10c = mesh->dim_;
    if (3 < local_10c) {
      pcVar11 = "0 <= dim_ && dim_ <= 3";
      pcVar8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
      ;
      uVar7 = 0x33;
      goto LAB_0022ea47;
    }
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_10c,0);
    local_b8 = Mesh::parting(mesh);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_b8,0);
  }
  else {
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_b4,0);
    Mesh::set_family(mesh,local_b4);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_10c,0);
    Mesh::set_dim(mesh,local_10c);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_b8,0);
    Mesh::set_parting(mesh,local_b8,false);
    Mesh::set_verts(mesh,0);
  }
  local_118 = mesh;
  if (-1 < (int)local_10c) {
    uVar5 = 0;
    do {
      pMVar2 = local_118;
      local_120 = uVar5;
      if ((int)uVar5 != 0 && !is_source) {
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
        Read<int>::Read(&local_40,(initializer_list<int>)ZEXT816(0),&local_140);
        Adj::Adj((Adj *)local_108,&local_40);
        pAVar12 = local_40.write_.shared_alloc_.alloc;
        if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
            local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
            operator_delete(pAVar12,0x48);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((int)local_120 != 1) {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
          Read<signed_char>::Read(&local_d8,(initializer_list<signed_char>)ZEXT816(0),&local_140);
          pAVar12 = local_e8;
          if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
            piVar1 = &local_e8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_e8);
              operator_delete(pAVar12,0x48);
            }
          }
          local_e8 = local_d8.write_.shared_alloc_.alloc;
          local_e0 = local_d8.write_.shared_alloc_.direct_ptr;
          if ((((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
               local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')
             ) {
            (local_d8.write_.shared_alloc_.alloc)->use_count =
                 (local_d8.write_.shared_alloc_.alloc)->use_count + -1;
            local_e8 = (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          local_d8.write_.shared_alloc_.alloc = (Alloc *)0x0;
          local_d8.write_.shared_alloc_.direct_ptr = (void *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
        }
        local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)local_108._0_8_;
        if ((local_108._0_8_ & 7) == 0 && (Alloc *)local_108._0_8_ != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b0.super_Graph.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)(*(long *)local_108._0_8_ * 8 + 1);
          }
          else {
            *(int *)(local_108._0_8_ + 0x30) = *(int *)(local_108._0_8_ + 0x30) + 1;
          }
        }
        local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)CONCAT71(local_108._17_7_,local_108[0x10]);
        local_b0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr = (void *)local_108._8_8_;
        if ((local_108[0x10] & 7) == 0 &&
            local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_b0.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_b0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_108._24_8_;
        local_b0.codes.write_.shared_alloc_.alloc = local_e8;
        if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b0.codes.write_.shared_alloc_.alloc = (Alloc *)(local_e8->size * 8 + 1);
          }
          else {
            local_e8->use_count = local_e8->use_count + 1;
          }
        }
        local_b0.codes.write_.shared_alloc_.direct_ptr = local_e0;
        Mesh::set_ents(pMVar2,(Int)local_120,&local_b0);
        Adj::~Adj(&local_b0);
        Adj::~Adj((Adj *)local_108);
      }
      if (is_source) {
        IVar4 = Mesh::ntags(pMVar2,(Int)local_120);
        local_d8.write_.shared_alloc_.alloc =
             (Alloc *)CONCAT44(local_d8.write_.shared_alloc_.alloc._4_4_,IVar4);
      }
      Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,(int *)&local_d8,0);
      if (0 < (int)local_d8.write_.shared_alloc_.alloc) {
        i = 0;
        do {
          if (is_source) {
            this = Mesh::get_tag(local_118,(Int)local_120,i);
          }
          else {
            this = (TagBase *)0x0;
          }
          local_108._0_8_ = local_108 + 0x10;
          local_108._8_8_ = (void *)0x0;
          local_108[0x10] = 0;
          if (is_source) {
            TagBase::name_abi_cxx11_(this);
            std::__cxx11::string::_M_assign((string *)local_108);
          }
          Comm::bcast_string((new_comm->
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                             (string *)local_108,0);
          if (is_source) {
            local_144 = TagBase::ncomps(this);
          }
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,&local_144,0);
          if (is_source) {
            local_bc = (*this->_vptr_TagBase[2])(this);
          }
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,&local_bc,0);
          IVar4 = local_144;
          if (!is_source) {
            switch(local_bc) {
            case 0:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
              Read<signed_char>::Read
                        (&local_50,(initializer_list<signed_char>)ZEXT816(0),&local_140);
              Mesh::add_tag<signed_char>
                        (local_118,(Int)local_120,(string *)local_108,IVar4,&local_50,false);
              pAVar12 = local_50.write_.shared_alloc_.alloc;
              break;
            default:
              goto switchD_0022e66e_caseD_1;
            case 2:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
              Read<int>::Read(&local_60,(initializer_list<int>)ZEXT816(0),&local_140);
              Mesh::add_tag<int>(local_118,(Int)local_120,(string *)local_108,IVar4,&local_60,false)
              ;
              pAVar12 = local_60.write_.shared_alloc_.alloc;
              break;
            case 3:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
              Read<long>::Read(&local_70,(initializer_list<long>)ZEXT816(0),&local_140);
              Mesh::add_tag<long>(local_118,(Int)local_120,(string *)local_108,IVar4,&local_70,false
                                 );
              pAVar12 = local_70.write_.shared_alloc_.alloc;
              break;
            case 5:
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_140);
              Read<double>::Read(&local_80,(initializer_list<double>)ZEXT816(0),&local_140);
              Mesh::add_tag<double>
                        (local_118,(Int)local_120,(string *)local_108,IVar4,&local_80,false);
              pAVar12 = local_80.write_.shared_alloc_.alloc;
            }
            if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
              piVar1 = &pAVar12->use_count;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                Alloc::~Alloc(pAVar12);
                operator_delete(pAVar12,0x48);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
          }
switchD_0022e66e_caseD_1:
          if ((Alloc *)local_108._0_8_ != (Alloc *)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
          }
          i = i + 1;
        } while (i < (int)local_d8.write_.shared_alloc_.alloc);
      }
      uVar5 = (ulong)((int)local_120 + 1);
    } while ((int)local_120 < (int)local_10c);
  }
  pMVar2 = local_118;
  if (is_source) {
    local_d8.write_.shared_alloc_.alloc =
         (Alloc *)CONCAT44(local_d8.write_.shared_alloc_.alloc._4_4_,
                           (int)(local_118->class_sets)._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_d8,0);
    p_Var6 = (pMVar2->class_sets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var6 = (_Base_ptr)0x0;
    Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(int *)&local_d8,0);
  }
  if (0 < (int)local_d8.write_.shared_alloc_.alloc) {
    local_118 = (Mesh *)&local_118->class_sets;
    uVar5 = 0;
    do {
      local_108._0_8_ = local_108 + 0x10;
      local_108._8_8_ = (void *)0x0;
      local_108[0x10] = '\0';
      if (is_source) {
        std::__cxx11::string::_M_assign((string *)local_108);
      }
      Comm::bcast_string((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)local_108,0);
      if (is_source) {
        local_144 = (Int)((ulong)((long)p_Var6[2]._M_parent - *(long *)(p_Var6 + 2)) >> 3);
      }
      local_120 = uVar5;
      Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,&local_144,0);
      if (0 < local_144) {
        lVar10 = 0;
        do {
          if (is_source) {
            local_140._M_dataplus._M_p = *(pointer *)(*(long *)(p_Var6 + 2) + lVar10 * 8);
          }
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,(int *)&local_140,0);
          Comm::bcast<int>((new_comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr,(int *)((long)&local_140._M_dataplus._M_p + 4),0);
          if (!is_source) {
            this_00 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                                    *)local_118,(key_type *)local_108);
            __position._M_current = *(ClassPair **)(this_00 + 8);
            if (__position._M_current == *(ClassPair **)(this_00 + 0x10)) {
              std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
              _M_realloc_insert<Omega_h::ClassPair_const&>
                        (this_00,__position,(ClassPair *)&local_140);
            }
            else {
              *__position._M_current = (ClassPair)local_140._M_dataplus._M_p;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_144);
      }
      if (is_source) {
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      }
      uVar5 = local_120;
      if ((Alloc *)local_108._0_8_ != (Alloc *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
      }
      uVar9 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar9;
    } while ((int)uVar9 < (int)local_d8.write_.shared_alloc_.alloc);
  }
  return;
}

Assistant:

void bcast_mesh(Mesh* mesh, CommPtr new_comm, bool is_source) {
  if (new_comm->rank() == 0) {
    OMEGA_H_CHECK(is_source);
  }
  I32 family;
  if (is_source) family = mesh->family();
  new_comm->bcast(family);
  if (!is_source) mesh->set_family(Omega_h_Family(family));
  I32 dim;
  if (is_source) dim = mesh->dim();
  new_comm->bcast(dim);
  if (!is_source) mesh->set_dim(dim);
  I32 parting;
  if (is_source) parting = mesh->parting();
  new_comm->bcast(parting);
  if (!is_source) mesh->set_parting(Omega_h_Parting(parting));
  if (!is_source) mesh->set_verts(0);
  for (Int d = 0; d <= dim; ++d) {
    if (d > VERT && !is_source) {
      Adj down(LOs({}));
      if (d - 1 != VERT) down.codes = Read<I8>({});
      mesh->set_ents(d, down);
    }
    I32 ntags;
    if (is_source) ntags = mesh->ntags(d);
    new_comm->bcast(ntags);
    for (Int i = 0; i < ntags; ++i) {
      TagBase const* tag = nullptr;
      if (is_source) tag = mesh->get_tag(d, i);
      std::string name;
      if (is_source) name = tag->name();
      new_comm->bcast_string(name);
      I32 ncomps;
      if (is_source) ncomps = tag->ncomps();
      new_comm->bcast(ncomps);
      I32 tag_type;
      if (is_source) tag_type = tag->type();
      new_comm->bcast(tag_type);
      if (!is_source) {
        switch (tag_type) {
          case OMEGA_H_I8:
            mesh->add_tag(d, name, ncomps, Read<I8>({}));
            break;
          case OMEGA_H_I32:
            mesh->add_tag(d, name, ncomps, Read<I32>({}));
            break;
          case OMEGA_H_I64:
            mesh->add_tag(d, name, ncomps, Read<I64>({}));
            break;
          case OMEGA_H_F64:
            mesh->add_tag(d, name, ncomps, Read<Real>({}));
            break;
        }
      }
    }
  }
  I32 nsets;
  if (is_source) nsets = I32(mesh->class_sets.size());
  new_comm->bcast(nsets);
  decltype(mesh->class_sets)::iterator it;
  if (is_source) it = mesh->class_sets.begin();
  for (I32 i = 0; i < nsets; ++i) {
    std::string name;
    if (is_source) name = it->first;
    new_comm->bcast_string(name);
    I32 npairs;
    if (is_source) npairs = I32(it->second.size());
    new_comm->bcast(npairs);
    for (I32 j = 0; j < npairs; ++j) {
      ClassPair pair;
      if (is_source) pair = it->second[std::size_t(j)];
      new_comm->bcast(pair.dim);
      new_comm->bcast(pair.id);
      if (!is_source) mesh->class_sets[name].push_back(pair);
    }
    if (is_source) ++it;
  }
}